

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QList<QLocale::Country> *
QLocale::countriesForLanguage(QList<QLocale::Country> *__return_storage_ptr__,Language language)

{
  QLocale *pQVar1;
  QList<QLocale> *__range1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QLocale> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QLocale *)&DAT_aaaaaaaaaaaaaaaa;
  matchingLocales((QList<QLocale> *)&local_48,language,AnyScript,AnyCountry);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Country *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QLocale::Country>::reserve(__return_storage_ptr__,local_48.size);
  pQVar1 = local_48.ptr;
  lVar3 = local_48.size << 3;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    QList<QLocale::Country>::append
              (__return_storage_ptr__,
               *(parameter_type *)(**(long **)((long)&(pQVar1->d).d.ptr + lVar2) + 4));
  }
  QArrayDataPointer<QLocale>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QLocale::Country> QLocale::countriesForLanguage(Language language)
{
    const auto locales = matchingLocales(language, AnyScript, AnyCountry);
    QList<Country> result;
    result.reserve(locales.size());
    for (const auto &locale : locales)
        result.append(locale.territory());
    return result;
}